

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dashel-posix.cpp
# Opt level: O3

void __thiscall Dashel::Hub::Hub(Hub *this,bool resolveIncomingNames)

{
  _Rb_tree_header *p_Var1;
  int iVar2;
  int *__pipedes;
  pthread_mutex_t *__mutex;
  
  this->_vptr_Hub = (_func_int **)&PTR__Hub_00121278;
  p_Var1 = &(this->streams)._M_t._M_impl.super__Rb_tree_header;
  (this->streams)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->streams)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->streams)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->streams)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->streams)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->dataStreams)._M_t._M_impl.super__Rb_tree_header;
  (this->dataStreams)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->dataStreams)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->dataStreams)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->dataStreams)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->dataStreams)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->resolveIncomingNames = resolveIncomingNames;
  __pipedes = (int *)operator_new__(8);
  iVar2 = pipe(__pipedes);
  if (iVar2 == 0) {
    this->hTerminate = __pipedes;
    __mutex = (pthread_mutex_t *)operator_new(0x28);
    this->streamsLock = __mutex;
    pthread_mutex_init(__mutex,(pthread_mutexattr_t *)0x0);
    return;
  }
  abort();
}

Assistant:

Hub::Hub(const bool resolveIncomingNames) :
		resolveIncomingNames(resolveIncomingNames)
	{
		int* terminationPipes = new int[2];
		if (pipe(terminationPipes) != 0)
			abort();
		hTerminate = terminationPipes;

		streamsLock = new pthread_mutex_t;

		pthread_mutex_init((pthread_mutex_t*)streamsLock, NULL);
	}